

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_texture_region
               (rf_texture2d texture,rf_rec source_rec,rf_rec dest_rec,rf_vec2 origin,float rotation
               ,rf_color tint)

{
  int iVar1;
  rf_render_batch *prVar2;
  long lVar3;
  rf_vertex_buffer *prVar4;
  rf_gfx_texcoord_data_type *prVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_88;
  float fStack_84;
  float local_58;
  
  fVar6 = source_rec.x;
  fVar7 = source_rec.y;
  if (texture.id == 0) {
    return;
  }
  fVar9 = source_rec.width;
  fVar10 = source_rec.height;
  fVar11 = fVar9;
  if (fVar9 < 0.0) {
    fVar11 = -fVar9;
  }
  if (fVar10 < 0.0) {
    fVar7 = fVar7 - fVar10;
  }
  fVar8 = fVar6;
  if (0.0 <= fVar9) {
    fVar8 = fVar11 + fVar6;
  }
  rf_gfx_enable_texture(texture.id);
  rf_gfx_push_matrix();
  local_58 = dest_rec.x;
  rf_gfx_translatef(local_58,dest_rec.y,0.0);
  rf_gfx_rotatef(rotation,0.0,0.0,1.0);
  rf_gfx_translatef(-origin.x,-origin.y,0.0);
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(tint.r,tint.g,tint.b,tint.a);
  fVar11 = (float)(~-(uint)(fVar9 < 0.0) & (uint)fVar6 |
                  -(uint)(fVar9 < 0.0) & (uint)(fVar11 + fVar6)) / (float)texture.width;
  fVar6 = fVar7 / (float)texture.height;
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  prVar5[(long)iVar1 * 2] = fVar11;
  prVar5[iVar1 * 2 + 1] = fVar6;
  prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
  rf_gfx_vertex3f(0.0,0.0,((rf__ctx->field_0).current_batch)->current_depth);
  fVar7 = (fVar10 + fVar7) / (float)texture.height;
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  prVar5[(long)iVar1 * 2] = fVar11;
  prVar5[iVar1 * 2 + 1] = fVar7;
  prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
  fStack_84 = dest_rec.height;
  rf_gfx_vertex3f(0.0,fStack_84,((rf__ctx->field_0).current_batch)->current_depth);
  fVar8 = fVar8 / (float)texture.width;
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  prVar5[(long)iVar1 * 2] = fVar8;
  prVar5[iVar1 * 2 + 1] = fVar7;
  prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
  local_88 = dest_rec.width;
  rf_gfx_vertex3f(local_88,fStack_84,((rf__ctx->field_0).current_batch)->current_depth);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  prVar5[(long)iVar1 * 2] = fVar8;
  prVar5[iVar1 * 2 + 1] = fVar6;
  prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
  rf_gfx_vertex3f(local_88,0.0,((rf__ctx->field_0).current_batch)->current_depth);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_texture_region(rf_texture2d texture, rf_rec source_rec, rf_rec dest_rec, rf_vec2 origin, float rotation, rf_color tint)
{
    // Check if texture is valid
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        bool flip_x = false;

        if (source_rec.width < 0) { flip_x = true; source_rec.width *= -1; }
        if (source_rec.height < 0) source_rec.y -= source_rec.height;

        rf_gfx_enable_texture(texture.id);

        rf_gfx_push_matrix();
            rf_gfx_translatef(dest_rec.x, dest_rec.y, 0.0f);
            rf_gfx_rotatef(rotation, 0.0f, 0.0f, 1.0f);
            rf_gfx_translatef(-origin.x, -origin.y, 0.0f);

            rf_gfx_begin(RF_QUADS);
                rf_gfx_color4ub(tint.r, tint.g, tint.b, tint.a);
                rf_gfx_normal3f(0.0f, 0.0f, 1.0f); // Normal vector pointing towards viewer

                // Bottom-left corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, source_rec.y / height);
                else rf_gfx_tex_coord2f(source_rec.x / width, source_rec.y / height);
                rf_gfx_vertex2f(0.0f, 0.0f);

                // Bottom-right corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, (source_rec.y + source_rec.height) / height);
                else rf_gfx_tex_coord2f(source_rec.x / width, (source_rec.y + source_rec.height) / height);
                rf_gfx_vertex2f(0.0f, dest_rec.height);

                // Top-right corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f(source_rec.x / width, (source_rec.y + source_rec.height) / height);
                else rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, (source_rec.y + source_rec.height) / height);
                rf_gfx_vertex2f(dest_rec.width, dest_rec.height);

                // Top-left corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f(source_rec.x / width, source_rec.y / height);
                else rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, source_rec.y / height);
                rf_gfx_vertex2f(dest_rec.width, 0.0f);
            rf_gfx_end();
        rf_gfx_pop_matrix();

        rf_gfx_disable_texture();
    }
}